

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O2

void Gia_IsoTestOld(Gia_Man_t *p,int fVerbose)

{
  abctime aVar1;
  Vec_Ptr_t *pVVar2;
  abctime aVar3;
  ulong uVar4;
  abctime time;
  char *pStr;
  Vec_Ptr_t *vEquivs;
  
  aVar1 = Abc_Clock();
  pVVar2 = Gia_IsoDeriveEquivPos(p,0,fVerbose);
  pStr = (char *)(ulong)(uint)(p->vCos->nSize - p->nRegs);
  if (pVVar2 == (Vec_Ptr_t *)0x0) {
    uVar4 = 1;
  }
  else {
    uVar4 = (ulong)(uint)pVVar2->nSize;
  }
  vEquivs = pVVar2;
  printf("Reduced %d outputs to %d.  ",pStr,uVar4);
  aVar3 = Abc_Clock();
  Abc_PrintTime((int)aVar3 - (int)aVar1,pStr,time);
  if ((pVVar2 != (Vec_Ptr_t *)0x0 && fVerbose != 0) && (p->vCos->nSize - p->nRegs != pVVar2->nSize))
  {
    puts("Nontrivial classes:");
  }
  Vec_VecFreeP((Vec_Vec_t **)&vEquivs);
  return;
}

Assistant:

void Gia_IsoTestOld( Gia_Man_t * p, int fVerbose )
{
    Vec_Ptr_t * vEquivs;
    abctime clk = Abc_Clock(); 
    vEquivs = Gia_IsoDeriveEquivPos( p, 0, fVerbose );
    printf( "Reduced %d outputs to %d.  ", Gia_ManPoNum(p), vEquivs ? Vec_PtrSize(vEquivs) : 1 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( fVerbose && vEquivs && Gia_ManPoNum(p) != Vec_PtrSize(vEquivs) )
    {
        printf( "Nontrivial classes:\n" );
//        Vec_VecPrintInt( (Vec_Vec_t *)vEquivs, 1 );
    }
    Vec_VecFreeP( (Vec_Vec_t **)&vEquivs );
}